

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O3

back_insert_iterator<std::vector<int,_std::allocator<int>_>_>
get_simplex_vertices<std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
          (index_t idx,index_t dim,index_t v,binomial_coeff_table *binomial_coeff,
          back_insert_iterator<std::vector<int,_std::allocator<int>_>_> out)

{
  iterator __position;
  ulong uVar1;
  int k;
  int local_34;
  
  local_34 = v + -1;
  if (-1 < dim) {
    uVar1 = (ulong)(dim + 1);
    k = dim + 2;
    do {
      k = k + -1;
      get_next_vertex(&local_34,idx,k,binomial_coeff);
      __position._M_current =
           ((out.container)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          ((out.container)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)out.container,__position,&local_34);
      }
      else {
        *__position._M_current = local_34;
        ((out.container)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      idx = idx - *(int *)(*(long *)&(binomial_coeff->B).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[local_34].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl +
                          uVar1 * 4);
      uVar1 = uVar1 - 1;
    } while (1 < k);
  }
  return (back_insert_iterator<std::vector<int,_std::allocator<int>_>_>)
         (back_insert_iterator<std::vector<int,_std::allocator<int>_>_>)out.container;
}

Assistant:

OutputIterator get_simplex_vertices(index_t idx, const index_t dim, index_t v,
                                    const binomial_coeff_table& binomial_coeff, OutputIterator out) {
	--v;
	for (index_t k = dim + 1; k > 0; --k) {
		get_next_vertex(v, idx, k, binomial_coeff);
		*out++ = v;
		idx -= binomial_coeff(v, k);
	}
	return out;
}